

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HighsRbTree.h
# Opt level: O1

int __thiscall
highs::CacheMinRbTree<HighsNodeQueue::NodeHybridEstimRbTree>::link
          (CacheMinRbTree<HighsNodeQueue::NodeHybridEstimRbTree> *this,char *__from,char *__to)

{
  long lVar1;
  int iVar2;
  long lVar3;
  long lVar4;
  int iVar5;
  double dVar6;
  double dVar7;
  
  if ((char *)*this->first_ != __to) goto code_r0x0019e7d0;
  if (__to != (char *)0xffffffffffffffff) {
    lVar1 = this[1].super_RbTree<HighsNodeQueue::NodeHybridEstimRbTree>.rootNode[1];
    lVar4 = (long)__from * 0x90;
    lVar3 = (long)__to * 0x90;
    dVar6 = *(double *)(lVar1 + 0x48 + lVar4) * 0.5 + *(double *)(lVar1 + 0x50 + lVar4) * 0.5;
    dVar7 = *(double *)(lVar1 + 0x48 + lVar3) * 0.5 + *(double *)(lVar1 + 0x50 + lVar3) * 0.5;
    if (dVar7 <= dVar6) {
      if (dVar6 <= dVar7) {
        iVar2 = (int)((ulong)(*(long *)(lVar1 + 8 + lVar3) - *(long *)(lVar1 + lVar3)) >> 4);
        iVar5 = (int)((ulong)(*(long *)(lVar1 + 8 + lVar4) - *(long *)(lVar1 + lVar4)) >> 4);
        if ((iVar2 < iVar5) || (((long)__from < (long)__to && (iVar2 <= iVar5)))) goto LAB_002d1f1c;
      }
code_r0x0019e7d0:
      iVar2 = RbTree<HighsNodeQueue::NodeHybridEstimRbTree>::link
                        (&this->super_RbTree<HighsNodeQueue::NodeHybridEstimRbTree>,__from,__to);
      return iVar2;
    }
  }
LAB_002d1f1c:
  *this->first_ = (LinkType)__from;
  iVar2 = RbTree<HighsNodeQueue::NodeHybridEstimRbTree>::link
                    (&this->super_RbTree<HighsNodeQueue::NodeHybridEstimRbTree>,__from,__to);
  return iVar2;
}

Assistant:

void link(LinkType z, LinkType parent) {
    if (first_ == parent) {
      if (parent == RbTreeLinks<LinkType>::noLink() ||
          static_cast<const Impl*>(this)->getKey(z) <
              static_cast<const Impl*>(this)->getKey(parent))
        first_ = z;
    }

    RbTree<Impl>::link(z, parent);
  }